

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferBase.cpp
# Opt level: O1

void Diligent::ValidateBufferInitData(BufferDesc *Desc,BufferData *pBuffData)

{
  char *pcVar1;
  int iVar2;
  undefined4 extraout_var;
  bool bVar3;
  char *local_40;
  unsigned_long local_38;
  char **Args_4;
  
  if (pBuffData == (BufferData *)0x0) {
    bVar3 = false;
  }
  else {
    bVar3 = pBuffData->pData != (void *)0x0;
  }
  if (Desc->Usage == USAGE_IMMUTABLE && !bVar3) {
    pcVar1 = (Desc->super_DeviceObjectAttribs).Name;
    local_40 = "";
    if (pcVar1 != (char *)0x0) {
      local_40 = pcVar1;
    }
    LogError<true,char[24],char_const*,char[15],char[89]>
              (false,"ValidateBufferInitData",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BufferBase.cpp"
               ,0xae,(char (*) [24])"Description of buffer \'",&local_40,
               (char (*) [15])"\' is invalid: ",
               (char (*) [89])
               "initial data must not be null as immutable buffers must be initialized at creation time."
              );
  }
  if ((bool)(Desc->Usage == USAGE_DYNAMIC & bVar3)) {
    pcVar1 = (Desc->super_DeviceObjectAttribs).Name;
    local_40 = "";
    if (pcVar1 != (char *)0x0) {
      local_40 = pcVar1;
    }
    LogError<true,char[24],char_const*,char[15],char[47]>
              (false,"ValidateBufferInitData",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BufferBase.cpp"
               ,0xb1,(char (*) [24])"Description of buffer \'",&local_40,
               (char (*) [15])"\' is invalid: ",
               (char (*) [47])"initial data must be null for dynamic buffers.");
  }
  if ((bool)(Desc->Usage == USAGE_SPARSE & bVar3)) {
    pcVar1 = (Desc->super_DeviceObjectAttribs).Name;
    local_40 = "";
    if (pcVar1 != (char *)0x0) {
      local_40 = pcVar1;
    }
    LogError<true,char[24],char_const*,char[15],char[46]>
              (false,"ValidateBufferInitData",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BufferBase.cpp"
               ,0xb4,(char (*) [24])"Description of buffer \'",&local_40,
               (char (*) [15])"\' is invalid: ",
               (char (*) [46])"initial data must be null for sparse buffers.");
  }
  if (Desc->Usage == USAGE_UNIFIED) {
    if ((bVar3) && ((Desc->CPUAccessFlags & CPU_ACCESS_FLAG_LAST) == CPU_ACCESS_NONE)) {
      pcVar1 = (Desc->super_DeviceObjectAttribs).Name;
      local_40 = "";
      if (pcVar1 != (char *)0x0) {
        local_40 = pcVar1;
      }
      LogError<true,char[24],char_const*,char[15],char[66]>
                (false,"ValidateBufferInitData",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BufferBase.cpp"
                 ,0xc1,(char (*) [24])"Description of buffer \'",&local_40,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [66])"CPU_ACCESS_WRITE flag is required to initialize a unified buffer.")
      ;
    }
  }
  else if ((Desc->Usage == USAGE_STAGING) &&
          ((bool)(Desc->CPUAccessFlags == CPU_ACCESS_FLAG_LAST & bVar3))) {
    pcVar1 = (Desc->super_DeviceObjectAttribs).Name;
    local_40 = "";
    if (pcVar1 != (char *)0x0) {
      local_40 = pcVar1;
    }
    LogError<true,char[24],char_const*,char[15],char[54]>
              (false,"ValidateBufferInitData",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BufferBase.cpp"
               ,0xba,(char (*) [24])"Description of buffer \'",&local_40,
               (char (*) [15])"\' is invalid: ",
               (char (*) [54])"CPU-writable staging buffers must be updated via map.");
  }
  if ((pBuffData != (BufferData *)0x0) && (pBuffData->pContext != (IDeviceContext *)0x0)) {
    iVar2 = (*(pBuffData->pContext->super_IObject)._vptr_IObject[4])();
    Args_4 = (char **)CONCAT44(extraout_var,iVar2);
    if (*(char *)((long)Args_4 + 9) == '\x01') {
      pcVar1 = (Desc->super_DeviceObjectAttribs).Name;
      local_40 = "";
      if (pcVar1 != (char *)0x0) {
        local_40 = pcVar1;
      }
      LogError<true,char[24],char_const*,char[15],char[56]>
                (false,"ValidateBufferInitData",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BufferBase.cpp"
                 ,0xc9,(char (*) [24])"Description of buffer \'",&local_40,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [56])"Deferred contexts can\'t be used to initialize resources");
    }
    if ((Desc->ImmediateContextMask >> ((ulong)*(byte *)((long)Args_4 + 10) & 0x3f) & 1) == 0) {
      pcVar1 = (Desc->super_DeviceObjectAttribs).Name;
      local_40 = "";
      if (pcVar1 != (char *)0x0) {
        local_40 = pcVar1;
      }
      local_38 = 1L << (*(byte *)((long)Args_4 + 10) & 0x3f);
      LogError<true,char[24],char_const*,char[15],char[50],char_const*,char[28],std::ios_base&(std::ios_base&),unsigned_long,char[20],std::ios_base&(std::ios_base&),unsigned_long,char[6]>
                (false,"ValidateBufferInitData",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BufferBase.cpp"
                 ,0xce,(char (*) [24])"Description of buffer \'",&local_40,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [50])"Can not initialize the buffer in device context \'",Args_4,
                 (char (*) [28])"\' as ImmediateContextMask (",std::hex,&Desc->ImmediateContextMask,
                 (char (*) [20])") does not contain ",std::hex,&local_38,(char (*) [6])" bit.");
    }
  }
  if ((bVar3) && (pBuffData->DataSize < Desc->Size)) {
    pcVar1 = (Desc->super_DeviceObjectAttribs).Name;
    local_40 = "";
    if (pcVar1 != (char *)0x0) {
      local_40 = pcVar1;
    }
    LogError<true,char[24],char_const*,char[15],char[26],unsigned_long,char[40],unsigned_long,char[2]>
              (false,"ValidateBufferInitData",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BufferBase.cpp"
               ,0xd5,(char (*) [24])"Description of buffer \'",&local_40,
               (char (*) [15])"\' is invalid: ",(char (*) [26])"Buffer initial DataSize (",
               &pBuffData->DataSize,(char (*) [40])") must be larger than the buffer size (",
               &Desc->Size,(char (*) [2])0x33e49a);
  }
  return;
}

Assistant:

void ValidateBufferInitData(const BufferDesc& Desc, const BufferData* pBuffData) noexcept(false)
{
    const bool HasInitialData = (pBuffData != nullptr && pBuffData->pData != nullptr);

    if (Desc.Usage == USAGE_IMMUTABLE && !HasInitialData)
        LOG_BUFFER_ERROR_AND_THROW("initial data must not be null as immutable buffers must be initialized at creation time.");

    if (Desc.Usage == USAGE_DYNAMIC && HasInitialData)
        LOG_BUFFER_ERROR_AND_THROW("initial data must be null for dynamic buffers.");

    if (Desc.Usage == USAGE_SPARSE && HasInitialData)
        LOG_BUFFER_ERROR_AND_THROW("initial data must be null for sparse buffers.");

    if (Desc.Usage == USAGE_STAGING)
    {
        if (Desc.CPUAccessFlags == CPU_ACCESS_WRITE)
        {
            VERIFY_BUFFER(!HasInitialData, "CPU-writable staging buffers must be updated via map.");
        }
    }
    else if (Desc.Usage == USAGE_UNIFIED)
    {
        if (HasInitialData && (Desc.CPUAccessFlags & CPU_ACCESS_WRITE) == 0)
        {
            LOG_BUFFER_ERROR_AND_THROW("CPU_ACCESS_WRITE flag is required to initialize a unified buffer.");
        }
    }

    if (pBuffData != nullptr && pBuffData->pContext != nullptr)
    {
        const DeviceContextDesc& CtxDesc = pBuffData->pContext->GetDesc();
        if (CtxDesc.IsDeferred)
            LOG_BUFFER_ERROR_AND_THROW("Deferred contexts can't be used to initialize resources");
        if ((Desc.ImmediateContextMask & (Uint64{1} << CtxDesc.ContextId)) == 0)
        {
            LOG_BUFFER_ERROR_AND_THROW("Can not initialize the buffer in device context '", CtxDesc.Name,
                                       "' as ImmediateContextMask (", std::hex, Desc.ImmediateContextMask, ") does not contain ",
                                       std::hex, (Uint64{1} << CtxDesc.ContextId), " bit.");
        }
    }

    if (HasInitialData)
    {
        VERIFY_BUFFER(pBuffData->DataSize >= Desc.Size,
                      "Buffer initial DataSize (", pBuffData->DataSize, ") must be larger than the buffer size (", Desc.Size, ")");
    }
}